

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::fat(fat *this)

{
  fat *this_local;
  
  this->NEW_FAT_TYPE = '\f';
  this->NEW_FAT_COPIES = '\x02';
  this->NEW_CLUSTER_SIZE = 0x200;
  this->FAT_UNUSED = 0x7ffffffe;
  this->FAT_FILE_END = 0x7ffffffd;
  this->FAT_BAD_CLUSTER = 0x7ffffffc;
  this->FAT_DIRECTORY = 0x7ffffffb;
  memset(&this->dir_info,0,0x18);
  std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::vector(&this->dir_info);
  memset(&this->cluster_data,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->cluster_data);
  return;
}

Assistant:

fat::fat() {

}